

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall
cppcms::widgets::base_html_input::render_input(base_html_input *this,form_context *context)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  base_widget::auto_generate
            ((base_widget *)
             ((long)&this->_vptr_base_html_input + (long)this->_vptr_base_html_input[-3]),context);
  poVar1 = form_context::out(context);
  if (context->widget_part_type_ != 0) {
    if (context->html_type_ == 1) {
      pcVar3 = " />";
      lVar2 = 3;
    }
    else {
      pcVar3 = " >";
      lVar2 = 2;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<input type=\"",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->type_)._M_dataplus._M_p,(this->type_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  (**(code **)(*(long *)((long)&this->_vptr_base_html_input + (long)this->_vptr_base_html_input[-3])
              + 0x48))
            ((_func_int *)
             ((long)&this->_vptr_base_html_input + (long)this->_vptr_base_html_input[-3]),context);
  (*this->_vptr_base_html_input[3])(this,context);
  return;
}

Assistant:

void base_html_input::render_input(form_context &context)
{
	auto_generate(&context);

	std::ostream &output=context.out();
	if(context.widget_part() == first_part) {
		output<<"<input type=\""<<type_<<"\" ";
		render_attributes(context);
		render_value(context);
	}
	else {
		if(context.html() ==  as_xhtml)
			output<<" />";
		else
			output<<" >";
	}
}